

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_signature_algorithms(ptls_verify_certificate_t *vc,ptls_buffer_t *sendbuf)

{
  int iVar1;
  ulong body_size_00;
  uint16_t *local_60;
  size_t body_size;
  uint16_t *puStack_38;
  uint16_t _v;
  uint16_t *p;
  size_t body_start;
  size_t capacity;
  ptls_buffer_t *ppStack_18;
  int ret;
  ptls_buffer_t *sendbuf_local;
  ptls_verify_certificate_t *vc_local;
  
  body_start = 2;
  ppStack_18 = sendbuf;
  sendbuf_local = (ptls_buffer_t *)vc;
  capacity._4_4_ = ptls_buffer__do_pushv(sendbuf,"",2);
  if (capacity._4_4_ == 0) {
    p = (uint16_t *)ppStack_18->off;
    if (sendbuf_local == (ptls_buffer_t *)0x0) {
      local_60 = push_signature_algorithms::default_algos;
    }
    else {
      local_60 = (uint16_t *)sendbuf_local->capacity;
    }
    for (puStack_38 = local_60; capacity._4_4_ = 0, *puStack_38 != 0xffff;
        puStack_38 = puStack_38 + 1) {
      body_size._6_2_ = *puStack_38;
      body_size._4_1_ = (undefined1)(body_size._6_2_ >> 8);
      body_size._5_1_ = (undefined1)body_size._6_2_;
      iVar1 = ptls_buffer__do_pushv(ppStack_18,(void *)((long)&body_size + 4),2);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    body_size_00 = ppStack_18->off - (long)p;
    if (body_start == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(ppStack_18,body_size_00);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= body_size_00)) {
        return 0x20c;
      }
      for (; body_start != 0; body_start = body_start - 1) {
        *(char *)((long)p + ((long)ppStack_18->base - body_start)) =
             (char)(body_size_00 >> (((char)body_start + -1) * '\b' & 0x3fU));
      }
    }
    capacity._4_4_ = 0;
  }
  return capacity._4_4_;
}

Assistant:

static int push_signature_algorithms(ptls_verify_certificate_t *vc, ptls_buffer_t *sendbuf)
{
    /* The list sent when verify callback is not registered */
    static const uint16_t default_algos[] = {PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256,
                                             PTLS_SIGNATURE_RSA_PKCS1_SHA256, PTLS_SIGNATURE_RSA_PKCS1_SHA1, UINT16_MAX};
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        for (const uint16_t *p = vc != NULL ? vc->algos : default_algos; *p != UINT16_MAX; ++p)
            ptls_buffer_push16(sendbuf, *p);
    });

    ret = 0;
Exit:
    return ret;
}